

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O3

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>_> *this)

{
  *(undefined ***)
   &(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>).super_TPZMultiphysicsElement.
    super_TPZCompEl = &PTR__TPZSavable_01938278;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::TPZMultiphysicsCompEl
            (&this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>,&PTR_PTR_01937858);
  *(undefined ***)
   &(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>).super_TPZMultiphysicsElement.
    super_TPZCompEl = &PTR__TPZCompElWithMem_01937548;
  TPZVec<long>::TPZVec((TPZVec<long> *)&this->fIntPtIndices,0);
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore =
       (this->fIntPtIndices).super_TPZManVector<long,_128>.fExtAlloc;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNAlloc = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0193acb8;
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem() : TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE() {
    //PrepareIntPtIndices();
}